

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O0

void __thiscall
cfd::core::Address::DecodeAddress
          (Address *this,string *address_string,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *network_parameters)

{
  pointer *this_00;
  uint8_t uVar1;
  bool bVar2;
  uint8_t uVar3;
  int iVar4;
  uint uVar5;
  WitnessVersion WVar6;
  NetType_conflict NVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  char *addr_family;
  uchar *puVar11;
  size_type sVar12;
  undefined8 uVar13;
  reference this_01;
  reference pvVar14;
  AddressFormatData *in_stack_fffffffffffff9f8;
  Script *in_stack_fffffffffffffa00;
  AddressFormatData *this_02;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_fffffffffffffa08;
  allocator *paVar15;
  undefined4 in_stack_fffffffffffffa10;
  undefined4 in_stack_fffffffffffffa14;
  size_type in_stack_fffffffffffffa18;
  CfdError CVar16;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_03;
  CfdException *in_stack_fffffffffffffa20;
  bool local_4a9;
  allocator local_481;
  string local_480;
  string local_460;
  NetType_conflict local_43c;
  CfdSourceLocation local_438;
  SchnorrPubkey local_420;
  ByteData local_408;
  uchar *local_3f0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_3e8;
  const_iterator local_3e0;
  undefined1 local_3d2;
  allocator local_3d1;
  string local_3d0 [32];
  CfdSourceLocation local_3b0;
  AddressFormatData *local_398;
  AddressFormatData *local_390;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *__range4_1;
  AddressFormatData *local_370;
  const_iterator __end4;
  const_iterator __begin4;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *__range4;
  string local_350 [5];
  bool find_address_type;
  undefined1 local_32a;
  allocator local_329;
  string local_328 [32];
  CfdSourceLocation local_308;
  uchar *local_2f0;
  uchar *local_2e8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2e0;
  const_iterator local_2d8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2d0;
  const_iterator local_2c8;
  undefined1 local_2ba;
  allocator local_2b9;
  string local_2b8 [38];
  undefined1 local_292;
  allocator local_291;
  string local_290 [32];
  ByteData local_270;
  undefined1 local_258 [8];
  Script script;
  string local_218 [38];
  undefined1 local_1f2;
  allocator local_1f1;
  string local_1f0 [32];
  CfdSourceLocation local_1d0;
  size_t local_1b8;
  size_t written;
  undefined1 local_1a8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data_part;
  string local_170;
  reference local_150;
  AddressFormatData *local_148;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *__range3_1;
  byte local_109;
  string local_108;
  byte local_e1;
  string local_e0;
  string local_c0;
  reference local_a0;
  AddressFormatData *param;
  const_iterator __end3;
  const_iterator __begin3;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *__range3;
  int ret;
  string segwit_prefix;
  string bs58;
  allocator local_21;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *local_20;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  *network_parameters_local;
  string *address_string_local;
  Address *this_local;
  
  local_20 = network_parameters;
  network_parameters_local =
       (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
       address_string;
  address_string_local = (string *)this;
  if ((DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
       ::kBech32Separator_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
                                   ::kBech32Separator_abi_cxx11_), iVar4 != 0)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)
               &DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
                ::kBech32Separator_abi_cxx11_,"1",&local_21);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_21);
    __cxa_atexit(::std::__cxx11::string::~string,
                 &DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
                  ::kBech32Separator_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
                         ::kBech32Separator_abi_cxx11_);
  }
  ::std::__cxx11::string::string
            ((string *)(segwit_prefix.field_2._M_local_buf + 8),(string *)address_string);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&ret,"",(allocator *)((long)&__range3 + 7));
  ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
  __range3._0_4_ = 0xffffffff;
  if (local_20 ==
      (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)0x0) {
    __end3_1 = ::std::
               vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
               begin((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                      *)in_stack_fffffffffffff9f8);
    local_148 = (AddressFormatData *)
                ::std::
                vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ::end((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                       *)in_stack_fffffffffffff9f8);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
                               *)in_stack_fffffffffffffa00,
                              (__normal_iterator<const_cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
                               *)in_stack_fffffffffffff9f8), bVar2) {
      local_150 = __gnu_cxx::
                  __normal_iterator<const_cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
                  ::operator*(&__end3_1);
      AddressFormatData::GetBech32Hrp_abi_cxx11_(&local_170,local_150);
      bVar2 = DecodeAddress::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)
                         &DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
                          ::StartsWith,(string *)((long)&segwit_prefix.field_2 + 8),&local_170);
      ::std::__cxx11::string::~string((string *)&local_170);
      if (bVar2) {
        AddressFormatData::GetBech32Hrp_abi_cxx11_
                  ((string *)
                   &data_part.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,local_150);
        this_00 = &data_part.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        ::std::__cxx11::string::operator=((string *)&ret,(string *)this_00);
        ::std::__cxx11::string::~string((string *)this_00);
        AddressFormatData::operator=
                  ((AddressFormatData *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
      ::operator++(&__end3_1);
    }
  }
  else {
    __end3 = ::std::
             vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
             begin((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                    *)in_stack_fffffffffffff9f8);
    param = (AddressFormatData *)
            ::std::
            vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::end
                      ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                        *)in_stack_fffffffffffff9f8);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
                               *)in_stack_fffffffffffffa00,
                              (__normal_iterator<const_cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
                               *)in_stack_fffffffffffff9f8), bVar2) {
      local_a0 = __gnu_cxx::
                 __normal_iterator<const_cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
                 ::operator*(&__end3);
      local_e1 = 0;
      local_109 = 0;
      AddressFormatData::GetBech32Hrp_abi_cxx11_(&local_c0,local_a0);
      uVar5 = ::std::__cxx11::string::empty();
      local_4a9 = false;
      if ((uVar5 & 1) == 0) {
        AddressFormatData::GetBech32Hrp_abi_cxx11_(&local_e0,local_a0);
        local_e1 = 1;
        uVar9 = ::std::__cxx11::string::length();
        uVar8 = ::std::__cxx11::string::length();
        local_4a9 = false;
        if (uVar9 < uVar8) {
          AddressFormatData::GetBech32Hrp_abi_cxx11_(&local_108,local_a0);
          local_109 = 1;
          local_4a9 = DecodeAddress::anon_class_1_0_00000001::operator()
                                ((anon_class_1_0_00000001 *)
                                 &DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
                                  ::StartsWith,(string *)((long)&segwit_prefix.field_2 + 8),
                                 &local_108);
        }
      }
      if ((local_109 & 1) != 0) {
        ::std::__cxx11::string::~string((string *)&local_108);
      }
      if ((local_e1 & 1) != 0) {
        ::std::__cxx11::string::~string((string *)&local_e0);
      }
      ::std::__cxx11::string::~string((string *)&local_c0);
      if (local_4a9 != false) {
        AddressFormatData::GetBech32Hrp_abi_cxx11_((string *)&__range3_1,local_a0);
        ::std::__cxx11::string::operator=((string *)&ret,(string *)&__range3_1);
        ::std::__cxx11::string::~string((string *)&__range3_1);
        AddressFormatData::operator=
                  ((AddressFormatData *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
      ::operator++(&__end3);
    }
  }
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x456a6f);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa20,
             in_stack_fffffffffffffa18,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x456a95);
  local_1b8 = 0;
  uVar9 = ::std::__cxx11::string::empty();
  if ((uVar9 & 1) == 0) {
    pcVar10 = (char *)::std::__cxx11::string::data();
    addr_family = (char *)::std::__cxx11::string::data();
    puVar11 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x456ae4);
    sVar12 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8);
    __range3._0_4_ = wally_addr_segwit_to_bytes(pcVar10,addr_family,0,puVar11,sVar12,&local_1b8);
    if ((int)__range3 != 0) {
      local_1d0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_address.cpp"
                   ,0x2f);
      CVar16 = (CfdError)(in_stack_fffffffffffffa18 >> 0x20);
      local_1d0.filename = local_1d0.filename + 1;
      local_1d0.line = 0x425;
      local_1d0.funcname = "DecodeAddress";
      logger::warn<int&>(&local_1d0,"wally_addr_segwit_to_bytes error. ret={}.",(int *)&__range3);
      if ((int)__range3 != -2) {
        script.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
        uVar13 = __cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_218,"Segwit-address decode error.",
                   (allocator *)
                   ((long)&script.script_stack_.
                           super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        CfdException::CfdException
                  (in_stack_fffffffffffffa20,CVar16,
                   (string *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
        script.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
        __cxa_throw(uVar13,&CfdException::typeinfo,CfdException::~CfdException);
      }
      local_1f2 = 1;
      uVar13 = __cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1f0,"Segwit-address decode error.",&local_1f1);
      CfdException::CfdException
                (in_stack_fffffffffffffa20,CVar16,
                 (string *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
      local_1f2 = 0;
      __cxa_throw(uVar13,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa20,
               in_stack_fffffffffffffa18);
    CVar16 = (CfdError)(in_stack_fffffffffffffa18 >> 0x20);
    puVar11 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x456d87);
    ByteData::ByteData(&local_270,puVar11,(uint32_t)local_1b8);
    Script::Script((Script *)local_258,&local_270);
    ByteData::~ByteData((ByteData *)0x456dbf);
    bVar2 = Script::IsWitnessProgram((Script *)local_258);
    if (!bVar2) {
      local_292 = 1;
      uVar13 = __cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_290,"address decode check error.",&local_291);
      CfdException::CfdException
                (in_stack_fffffffffffffa20,CVar16,
                 (string *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
      local_292 = 0;
      __cxa_throw(uVar13,&CfdException::typeinfo,CfdException::~CfdException);
    }
    WVar6 = Script::GetWitnessVersion((Script *)local_258);
    this->witness_ver_ = WVar6;
    if (this->witness_ver_ == kVersion1) {
      if (local_1b8 != 0x22) {
        local_2ba = 1;
        uVar13 = __cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_2b8,"segwit v1 address decode check error.",&local_2b9)
        ;
        CfdException::CfdException
                  (in_stack_fffffffffffffa20,CVar16,
                   (string *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
        local_2ba = 0;
        __cxa_throw(uVar13,&CfdException::typeinfo,CfdException::~CfdException);
      }
      SetAddressType(this,kTaprootAddress);
    }
    else if (this->witness_ver_ == kVersion0) {
      if (local_1b8 == 0x16) {
        SetAddressType(this,kP2wpkhAddress);
      }
      else if (local_1b8 == 0x22) {
        SetAddressType(this,kP2wshAddress);
      }
    }
    local_2d0._M_current =
         (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             in_stack_fffffffffffff9f8);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_2c8,&local_2d0);
    local_2e8 = (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    in_stack_fffffffffffff9f8);
    local_2e0 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(in_stack_fffffffffffffa08,(difference_type)in_stack_fffffffffffffa00);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_2d8,&local_2e0);
    local_2f0 = (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    local_1a8,local_2c8,local_2d8);
    Script::~Script(in_stack_fffffffffffffa00);
  }
  else {
    pcVar10 = (char *)::std::__cxx11::string::data();
    puVar11 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x45713e);
    sVar12 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8);
    __range3._0_4_ = wally_base58_to_bytes(pcVar10,1,puVar11,sVar12,&local_1b8);
    if ((int)__range3 != 0) {
      local_308.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_address.cpp"
                   ,0x2f);
      CVar16 = (CfdError)(in_stack_fffffffffffffa18 >> 0x20);
      local_308.filename = local_308.filename + 1;
      local_308.line = 1099;
      local_308.funcname = "DecodeAddress";
      logger::warn<int&>(&local_308,"wally_base58_to_bytes error. ret={}.",(int *)&__range3);
      if ((int)__range3 != -2) {
        __range4._6_1_ = 1;
        uVar13 = __cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_350,"Base58 decode error.",(allocator *)((long)&__range4 + 7));
        CfdException::CfdException
                  (in_stack_fffffffffffffa20,CVar16,
                   (string *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
        __range4._6_1_ = 0;
        __cxa_throw(uVar13,&CfdException::typeinfo,CfdException::~CfdException);
      }
      local_32a = 1;
      uVar13 = __cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_328,"Base58 decode error.",&local_329);
      CfdException::CfdException
                (in_stack_fffffffffffffa20,CVar16,
                 (string *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
      local_32a = 0;
      __cxa_throw(uVar13,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa20,
               in_stack_fffffffffffffa18);
    __range4._5_1_ = 0;
    if (local_20 ==
        (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)0x0)
    {
      __end4_1 = ::std::
                 vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 ::begin((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                          *)in_stack_fffffffffffff9f8);
      local_390 = (AddressFormatData *)
                  ::std::
                  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  ::end((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                         *)in_stack_fffffffffffff9f8);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
                            *)in_stack_fffffffffffffa00,
                           (__normal_iterator<const_cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
                            *)in_stack_fffffffffffff9f8);
        CVar16 = (CfdError)(in_stack_fffffffffffffa18 >> 0x20);
        if (!bVar2) break;
        local_398 = __gnu_cxx::
                    __normal_iterator<const_cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
                    ::operator*(&__end4_1);
        pvVar14 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8,0);
        uVar1 = *pvVar14;
        uVar3 = AddressFormatData::GetP2shPrefix(local_398);
        CVar16 = (CfdError)(in_stack_fffffffffffffa18 >> 0x20);
        if (uVar1 == uVar3) {
          SetAddressType(this,kP2shAddress);
          __range4._5_1_ = 1;
          AddressFormatData::operator=
                    ((AddressFormatData *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
          break;
        }
        pvVar14 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8,0);
        uVar1 = *pvVar14;
        uVar3 = AddressFormatData::GetP2pkhPrefix(local_398);
        CVar16 = (CfdError)(in_stack_fffffffffffffa18 >> 0x20);
        if (uVar1 == uVar3) {
          SetAddressType(this,kP2pkhAddress);
          __range4._5_1_ = 1;
          AddressFormatData::operator=
                    ((AddressFormatData *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
          break;
        }
        __gnu_cxx::
        __normal_iterator<const_cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
        ::operator++(&__end4_1);
      }
    }
    else {
      __end4 = ::std::
               vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
               begin((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                      *)in_stack_fffffffffffff9f8);
      ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      end((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
          in_stack_fffffffffffff9f8);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
                            *)in_stack_fffffffffffffa00,
                           (__normal_iterator<const_cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
                            *)in_stack_fffffffffffff9f8);
        CVar16 = (CfdError)(in_stack_fffffffffffffa18 >> 0x20);
        if (!bVar2) break;
        this_01 = __gnu_cxx::
                  __normal_iterator<const_cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
                  ::operator*(&__end4);
        pvVar14 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8,0);
        uVar1 = *pvVar14;
        uVar3 = AddressFormatData::GetP2shPrefix(this_01);
        CVar16 = (CfdError)(in_stack_fffffffffffffa18 >> 0x20);
        if (uVar1 == uVar3) {
          SetAddressType(this,kP2shAddress);
          __range4._5_1_ = 1;
          AddressFormatData::operator=
                    ((AddressFormatData *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
          break;
        }
        pvVar14 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8,0);
        uVar1 = *pvVar14;
        uVar3 = AddressFormatData::GetP2pkhPrefix(this_01);
        CVar16 = (CfdError)(in_stack_fffffffffffffa18 >> 0x20);
        if (uVar1 == uVar3) {
          SetAddressType(this,kP2pkhAddress);
          __range4._5_1_ = 1;
          AddressFormatData::operator=
                    ((AddressFormatData *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
          break;
        }
        __gnu_cxx::
        __normal_iterator<const_cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
        ::operator++(&__end4);
      }
    }
    if ((__range4._5_1_ & 1) == 0) {
      local_3b0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_address.cpp"
                   ,0x2f);
      local_3b0.filename = local_3b0.filename + 1;
      local_3b0.line = 0x474;
      local_3b0.funcname = "DecodeAddress";
      logger::warn<>(&local_3b0,"Unknown address prefix.");
      local_3d2 = 1;
      uVar13 = __cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_3d0,"Unknown address prefix.",&local_3d1);
      CfdException::CfdException
                (in_stack_fffffffffffffa20,CVar16,
                 (string *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
      local_3d2 = 0;
      __cxa_throw(uVar13,&CfdException::typeinfo,CfdException::~CfdException);
    }
    this->witness_ver_ = kVersionNone;
    this_03 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8;
    local_3e8._M_current =
         (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             in_stack_fffffffffffff9f8);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_3e0,&local_3e8);
    local_3f0 = (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
                                   (this_03,local_3e0);
  }
  ByteData::ByteData(&local_408,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8);
  ByteData::operator=((ByteData *)in_stack_fffffffffffffa00,(ByteData *)in_stack_fffffffffffff9f8);
  ByteData::~ByteData((ByteData *)0x457856);
  if (this->witness_ver_ == kVersion1) {
    SchnorrPubkey::SchnorrPubkey(&local_420,&this->hash_);
    SchnorrPubkey::operator=(&this->schnorr_pubkey_,&local_420);
    SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x45789f);
  }
  SetNetType(this,&this->format_data_);
  local_438.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_address.cpp"
               ,0x2f);
  local_438.filename = local_438.filename + 1;
  local_438.line = 0x482;
  local_438.funcname = "DecodeAddress";
  NVar7 = AddressFormatData::GetNetType(&this->format_data_);
  this_02 = &this->format_data_;
  paVar15 = &local_481;
  local_43c = NVar7;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_480,"nettype",paVar15);
  AddressFormatData::GetString(&local_460,this_02,&local_480);
  logger::info<cfd::core::NetType,std::__cxx11::string>
            (&local_438,"DecodeAddress nettype={},{}",&local_43c,&local_460);
  ::std::__cxx11::string::~string((string *)&local_460);
  ::std::__cxx11::string::~string((string *)&local_480);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_481);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(NVar7,in_stack_fffffffffffffa10));
  ::std::__cxx11::string::~string((string *)&ret);
  ::std::__cxx11::string::~string((string *)(segwit_prefix.field_2._M_local_buf + 8));
  return;
}

Assistant:

void Address::DecodeAddress(
    std::string address_string,
    const std::vector<AddressFormatData>* network_parameters) {
  static const std::string kBech32Separator = "1";
  static const auto StartsWith = [](const std::string& message,
                                    const std::string& bech32_hrp) -> bool {
    return (message.find(bech32_hrp + kBech32Separator) == 0);
  };

  std::string bs58 = address_string;
  std::string segwit_prefix = "";
  int ret = -1;

  if (network_parameters != nullptr) {
    for (const AddressFormatData& param : *network_parameters) {
      // Custom parameter
      if ((!param.GetBech32Hrp().empty()) &&
          (param.GetBech32Hrp().length() < bs58.length()) &&
          (StartsWith(bs58, param.GetBech32Hrp()))) {
        segwit_prefix = param.GetBech32Hrp();
        format_data_ = param;
        break;
      }
    }
  } else {
    for (const auto& param : kBitcoinAddressFormatList) {
      if (StartsWith(bs58, param.GetBech32Hrp())) {
        segwit_prefix = param.GetBech32Hrp();
        format_data_ = param;
        break;
      }
    }
  }

  std::vector<uint8_t> data_part(128);
  size_t written = 0;

  if (!segwit_prefix.empty()) {
    // Bech32 Address
    ret = wally_addr_segwit_to_bytes(
        bs58.data(), segwit_prefix.data(), 0, data_part.data(),
        data_part.size(), &written);

    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_addr_segwit_to_bytes error. ret={}.", ret);
      if (ret == WALLY_EINVAL) {
        throw CfdException(
            kCfdIllegalArgumentError, "Segwit-address decode error.");
      } else {
        throw CfdException(kCfdInternalError, "Segwit-address decode error.");
      }
    }

    data_part.resize(written);
    Script script(ByteData(data_part.data(), static_cast<uint32_t>(written)));
    if (!script.IsWitnessProgram()) {
      throw CfdException(kCfdInternalError, "address decode check error.");
    }
    witness_ver_ = script.GetWitnessVersion();

    if (witness_ver_ == kVersion1) {
      if (written != (SchnorrPubkey::kSchnorrPubkeySize + 2)) {
        throw CfdException(
            kCfdInternalError, "segwit v1 address decode check error.");
      }
      SetAddressType(kTaprootAddress);
    } else if (witness_ver_ == kVersion0) {
      if (written == kScriptHashP2wpkhLength) {
        SetAddressType(kP2wpkhAddress);
      } else if (written == kScriptHashP2wshLength) {
        SetAddressType(kP2wshAddress);
      }
    }

    // Delete 0byte:WitnessVersion and 1byte:data_part
    data_part.erase(data_part.begin(), data_part.begin() + 2);

  } else {
    ret = wally_base58_to_bytes(
        bs58.data(), BASE58_FLAG_CHECKSUM, data_part.data(), data_part.size(),
        &written);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_base58_to_bytes error. ret={}.", ret);
      if (ret == WALLY_EINVAL) {
        throw CfdException(kCfdIllegalArgumentError, "Base58 decode error.");
      } else {
        throw CfdException(kCfdInternalError, "Base58 decode error.");
      }
    }

    data_part.resize(written);

    bool find_address_type = false;
    if (network_parameters != nullptr) {
      for (const AddressFormatData& param : *network_parameters) {
        if (data_part[0] == param.GetP2shPrefix()) {
          SetAddressType(kP2shAddress);
          find_address_type = true;
          format_data_ = param;
          break;
        } else if (data_part[0] == param.GetP2pkhPrefix()) {
          SetAddressType(kP2pkhAddress);
          find_address_type = true;
          format_data_ = param;
          break;
        }
      }
    } else {
      for (const auto& param : kBitcoinAddressFormatList) {
        if (data_part[0] == param.GetP2shPrefix()) {
          SetAddressType(kP2shAddress);
          find_address_type = true;
          format_data_ = param;
          break;
        } else if (data_part[0] == param.GetP2pkhPrefix()) {
          SetAddressType(kP2pkhAddress);
          find_address_type = true;
          format_data_ = param;
          break;
        }
      }
    }
    if (!find_address_type) {
      warn(CFD_LOG_SOURCE, "Unknown address prefix.");
      throw CfdException(kCfdIllegalArgumentError, "Unknown address prefix.");
    }
    witness_ver_ = kVersionNone;

    // Delete 0byte:prefix.
    data_part.erase(data_part.begin());
  }

  // Setting for Hash.
  hash_ = ByteData(data_part);
  if (witness_ver_ == kVersion1) schnorr_pubkey_ = SchnorrPubkey(hash_);
  SetNetType(format_data_);
  info(
      CFD_LOG_SOURCE, "DecodeAddress nettype={},{}", format_data_.GetNetType(),
      format_data_.GetString(kNettype));
}